

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::stackBefore(QGraphicsItem *this,QGraphicsItem *sibling)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsScene *pQVar6;
  QGraphicsScenePrivate *this_00;
  ulong uVar7;
  int i;
  ulong uVar8;
  int i_1;
  QList<QGraphicsItem_*> *this_01;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (sibling != this) {
    if (sibling != (QGraphicsItem *)0x0) {
      pQVar4 = (this->d_ptr).d;
      pQVar5 = pQVar4->parent;
      if (pQVar5 == ((sibling->d_ptr).d)->parent) {
        if (pQVar5 == (QGraphicsItem *)0x0) {
          pQVar6 = pQVar4->scene;
          if (pQVar6 == (QGraphicsScene *)0x0) goto LAB_005774e1;
          this_00 = *(QGraphicsScenePrivate **)&pQVar6->field_0x8;
          this_01 = &this_00->topLevelItems;
          QGraphicsScenePrivate::ensureSequentialTopLevelSiblingIndexes(this_00);
        }
        else {
          pQVar4 = (pQVar5->d_ptr).d;
          this_01 = &pQVar4->children;
          QGraphicsItemPrivate::ensureSequentialSiblingIndex(pQVar4);
        }
        uVar1 = ((sibling->d_ptr).d)->siblingIndex;
        iVar2 = ((this->d_ptr).d)->siblingIndex;
        if ((int)uVar1 <= iVar2) {
          QList<QGraphicsItem_*>::move(this_01,(long)iVar2,(long)(int)uVar1);
          uVar7 = (this_01->d).size;
          for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if (uVar1 != uVar8) {
              pQVar4 = ((this_01->d).ptr[uVar8]->d_ptr).d;
              iVar3 = pQVar4->siblingIndex;
              if (((int)uVar1 <= iVar3) && (iVar3 <= iVar2)) {
                pQVar4->siblingIndex = iVar3 + 1;
              }
            }
          }
          ((this->d_ptr).d)->siblingIndex = uVar1;
          for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if (uVar1 != uVar8) {
              pQVar4 = ((this_01->d).ptr[uVar8]->d_ptr).d;
              iVar3 = pQVar4->siblingIndex;
              if (((int)uVar1 <= iVar3) && (iVar3 <= iVar2)) {
                (*pQVar4->_vptr_QGraphicsItemPrivate[10])();
                uVar7 = (this_01->d).size;
              }
            }
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            (*((this->d_ptr).d)->_vptr_QGraphicsItemPrivate[10])();
            return;
          }
          goto LAB_00577531;
        }
        goto LAB_00577513;
      }
    }
LAB_005774e1:
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    QMessageLogger::warning
              (local_50,"QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling",
               sibling);
  }
LAB_00577513:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00577531:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::stackBefore(const QGraphicsItem *sibling)
{
    if (sibling == this)
        return;
    if (!sibling || d_ptr->parent != sibling->parentItem()) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }
    QList<QGraphicsItem *> *siblings = d_ptr->parent
                                       ? &d_ptr->parent->d_ptr->children
                                       : (d_ptr->scene ? &d_ptr->scene->d_func()->topLevelItems : nullptr);
    if (!siblings) {
        qWarning("QGraphicsItem::stackUnder: cannot stack under %p, which must be a sibling", sibling);
        return;
    }

    // First, make sure that the sibling indexes have no holes. This also
    // marks the children list for sorting.
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->ensureSequentialSiblingIndex();
    else
        d_ptr->scene->d_func()->ensureSequentialTopLevelSiblingIndexes();

    // Only move items with the same Z value, and that need moving.
    int siblingIndex = sibling->d_ptr->siblingIndex;
    int myIndex = d_ptr->siblingIndex;
    if (myIndex >= siblingIndex) {
        siblings->move(myIndex, siblingIndex);
        // Fixup the insertion ordering.
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                ++index;
        }
        d_ptr->siblingIndex = siblingIndex;
        for (int i = 0; i < siblings->size(); ++i) {
            int &index = siblings->at(i)->d_ptr->siblingIndex;
            if (i != siblingIndex && index >= siblingIndex && index <= myIndex)
                siblings->at(i)->d_ptr->siblingOrderChange();
        }
        d_ptr->siblingOrderChange();
    }
}